

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitTupleMake
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,TupleMake *curr)

{
  Literal *this_00;
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar1;
  size_t sVar2;
  Literal *pLVar3;
  long lVar4;
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar5;
  undefined1 auStack_88 [8];
  Literals arguments;
  value_type arg;
  
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
  _M_str = (char *)0x0;
  auStack_88 = (undefined1  [8])0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  generateArguments(__return_storage_ptr__,this,(ExpressionList *)(curr + 0x10),
                    (Literals *)auStack_88);
  if ((__return_storage_ptr__->breakTo).super_IString.str._M_str == (char *)0x0) {
    IVar5 = (IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
             )SmallVector<wasm::Literal,_1UL>::end((SmallVector<wasm::Literal,_1UL> *)auStack_88);
    lVar4 = -0x18;
    this_00 = (Literal *)
              &arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    for (sVar2 = 0; IVar1.index = sVar2,
        IVar1.parent = (SmallVector<wasm::Literal,_1UL> *)auStack_88, IVar5 != IVar1;
        sVar2 = sVar2 + 1) {
      pLVar3 = (Literal *)
               (arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id + lVar4);
      if (sVar2 == 0) {
        pLVar3 = (Literal *)&arguments;
      }
      ::wasm::Literal::Literal(this_00,pLVar3);
      if (arg.field_0.func.super_IString.str._M_str < (char *)0x2) {
        __assert_fail("arg.type.isConcrete()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                      ,0x50e,
                      "Flow wasm::ExpressionRunner<wasm::ModuleRunner>::visitTupleMake(TupleMake *) [SubType = wasm::ModuleRunner]"
                     );
      }
      SmallVector<wasm::Literal,_1UL>::push_back
                ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__,this_00);
      ::wasm::Literal::~Literal(this_00);
      lVar4 = lVar4 + 0x18;
    }
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_88);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTupleMake(TupleMake* curr) {
    NOTE_ENTER("tuple.make");
    Literals arguments;
    Flow flow = generateArguments(curr->operands, arguments);
    if (flow.breaking()) {
      return flow;
    }
    for (auto arg : arguments) {
      assert(arg.type.isConcrete());
      flow.values.push_back(arg);
    }
    return flow;
  }